

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_inline_nested(void)

{
  int iVar1;
  int __fd;
  undefined8 uVar2;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  bson_t expected;
  bson_t bcon;
  bson_t third;
  bson_t bar;
  bson_t foo;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_300 [4];
  uint local_2fc;
  undefined1 local_280 [128];
  undefined1 local_200 [128];
  undefined1 local_180 [336];
  
  bson_init(local_300);
  bson_init(local_380);
  bson_init(local_180);
  bson_init(local_200);
  bson_init(local_280);
  bson_append_utf8(local_280,"hello",0xffffffff,"world",0xffffffff);
  bson_append_int32(local_200,"0",0xffffffff,1);
  bson_append_int32(local_200,"1",0xffffffff,2);
  bson_append_document(local_200,"2",0xffffffff,local_280);
  bson_append_array(local_180,"bar",0xffffffff,local_200);
  bson_append_document(local_380,"foo",0xffffffff,local_180);
  uVar2 = bson_bcon_magic();
  bcon_append(local_300,"foo","{","bar","[",uVar2,0xf,1,uVar2,0xf,2,"{","hello","world","}","]","}",
              0);
  __buf = (void *)bson_get_data(local_300);
  __buf_00 = (void *)bson_get_data(local_380);
  if (local_37c == local_2fc) {
    __s1 = (void *)bson_get_data(local_380);
    __s2 = (void *)bson_get_data(local_300);
    iVar1 = bcmp(__s1,__s2,(ulong)local_37c);
    if (iVar1 == 0) {
      bson_destroy(local_300);
      bson_destroy(local_380);
      bson_destroy(local_180);
      bson_destroy(local_200);
      bson_destroy(local_280);
      return;
    }
  }
  uVar2 = bson_as_canonical_extended_json(local_300,0);
  uVar3 = bson_as_canonical_extended_json(local_380,0);
  uVar7 = 0;
  uVar5 = local_37c;
  if (local_2fc < local_37c) {
    uVar7 = 0;
    uVar5 = local_2fc;
  }
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    if (*(char *)((long)__buf + (ulong)uVar7) != *(char *)((long)__buf_00 + (ulong)uVar7))
    goto LAB_0013273a;
  }
  uVar7 = local_2fc;
  if (local_2fc < local_37c) {
    uVar7 = local_37c;
  }
  uVar7 = uVar7 - 1;
LAB_0013273a:
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar7,uVar2,uVar3);
  iVar1 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar1 == -1) {
    pcVar6 = "fd1 != -1";
  }
  else if (__fd == -1) {
    pcVar6 = "fd2 != -1";
  }
  else {
    uVar4 = write(iVar1,__buf,(ulong)local_2fc);
    if (uVar4 == local_2fc) {
      uVar4 = write(__fd,__buf_00,(ulong)local_37c);
      if (uVar4 == local_37c) {
        close(iVar1);
        close(__fd);
        pcVar6 = "0";
      }
      else {
        pcVar6 = "(&expected)->len == bson_write (fd2, expected_data, (&expected)->len)";
      }
    }
    else {
      pcVar6 = "(&bcon)->len == bson_write (fd1, bson_data, (&bcon)->len)";
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
          ,0x1f6,"test_inline_nested",pcVar6);
  abort();
}

Assistant:

static void
test_inline_nested (void)
{
   bson_t bcon, expected, foo, bar, third;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&foo);
   bson_init (&bar);
   bson_init (&third);

   bson_append_utf8 (&third, "hello", -1, "world", -1);
   bson_append_int32 (&bar, "0", -1, 1);
   bson_append_int32 (&bar, "1", -1, 2);
   bson_append_document (&bar, "2", -1, &third);
   bson_append_array (&foo, "bar", -1, &bar);
   bson_append_document (&expected, "foo", -1, &foo);

   BCON_APPEND (&bcon,
                "foo",
                "{",
                "bar",
                "[",
                BCON_INT32 (1),
                BCON_INT32 (2),
                "{",
                "hello",
                "world",
                "}",
                "]",
                "}");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&foo);
   bson_destroy (&bar);
   bson_destroy (&third);
}